

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ZmqContextManager.cpp
# Opt level: O2

bool ZmqContextManager::setContextToLeakOnDelete(string *contextName)

{
  iterator iVar1;
  
  CLI::std::mutex::lock((mutex *)&contextLock);
  iVar1 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<ZmqContextManager>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<ZmqContextManager>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<ZmqContextManager>_>_>_>
          ::find(&contexts_abi_cxx11_._M_t,contextName);
  if ((_Rb_tree_header *)iVar1._M_node != &contexts_abi_cxx11_._M_t._M_impl.super__Rb_tree_header) {
    LOCK();
    *(undefined1 *)(*(long *)(iVar1._M_node + 2) + 0x28) = 1;
    UNLOCK();
  }
  pthread_mutex_unlock((pthread_mutex_t *)&contextLock);
  return false;
}

Assistant:

bool ZmqContextManager::setContextToLeakOnDelete(const std::string& contextName)
{
    std::lock_guard<std::mutex> conlock(contextLock);
    auto fnd = contexts.find(contextName);
    if (fnd != contexts.end()) {
        fnd->second->leakOnDelete = true;
    }
    return false;
}